

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

QRect __thiscall QMenuPrivate::rect(QMenuPrivate *this)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QWidget *this_00;
  QWidgetData *pQVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  QStyle *pQVar13;
  long in_FS_OFFSET;
  QRect QVar14;
  QStyleOption opt;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar13 = QWidget::style(this_00);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption((QStyleOption *)&local_78,0,0);
  QStyleOption::initFrom((QStyleOption *)&local_78,this_00);
  iVar10 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,0x1c,(QStyleOption *)&local_78,this_00);
  iVar11 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,0x1d,(QStyleOption *)&local_78,this_00);
  iVar12 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,0x1e,(QStyleOption *)&local_78,this_00);
  pQVar9 = this_00->data;
  iVar5 = (pQVar9->crect).x2.m_i;
  iVar6 = (pQVar9->crect).y2.m_i;
  sVar1 = (this->super_QWidgetPrivate).leftmargin;
  sVar2 = (this->super_QWidgetPrivate).topmargin;
  sVar3 = (this->super_QWidgetPrivate).rightmargin;
  sVar4 = (this->super_QWidgetPrivate).bottommargin;
  iVar7 = (pQVar9->crect).x1.m_i;
  iVar8 = (pQVar9->crect).y1.m_i;
  QStyleOption::~QStyleOption((QStyleOption *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar14.y1.m_i = iVar11 + iVar12 + (int)sVar2;
    QVar14.x1.m_i = iVar10 + iVar12 + (int)sVar1;
    QVar14.y2.m_i = iVar6 - (iVar8 + iVar11 + iVar12 + (int)sVar4);
    QVar14.x2.m_i = iVar5 - (iVar7 + iVar10 + iVar12 + (int)sVar3);
    return QVar14;
  }
  __stack_chk_fail();
}

Assistant:

QRect QMenuPrivate::rect() const
{
    Q_Q(const QMenu);
    QStyle *style = q->style();
    QStyleOption opt(0);
    opt.initFrom(q);
    const int hmargin = style->pixelMetric(QStyle::PM_MenuHMargin, &opt, q);
    const int vmargin = style->pixelMetric(QStyle::PM_MenuVMargin, &opt, q);
    const int fw = style->pixelMetric(QStyle::PM_MenuPanelWidth, &opt, q);
    return (q->rect().adjusted(hmargin + fw + leftmargin, vmargin + fw + topmargin,
                               -(hmargin + fw + rightmargin), -(vmargin + fw + bottommargin)));
}